

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string-tree.h
# Opt level: O0

void __thiscall
kj::StringTree::
fill<kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::CappedArray<char,14ul>,kj::ArrayPtr<char_const>,kj::StringTree,kj::StringTree,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::CappedArray<char,14ul>,kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::CappedArray<char,14ul>,kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::CappedArray<char,14ul>,kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::CappedArray<char,14ul>,kj::ArrayPtr<char_const>>
          (StringTree *this,size_t pos,String *branchIndex,ArrayPtr<const_char> *first,
          ArrayPtr<const_char> *rest,NoInfer<kj::ArrayPtr<const_char>_> *rest_1,
          NoInfer<kj::ArrayPtr<const_char>_> *rest_2,NoInfer<kj::ArrayPtr<const_char>_> *rest_3,
          NoInfer<kj::ArrayPtr<const_char>_> *rest_4,NoInfer<kj::ArrayPtr<const_char>_> *rest_5,
          NoInfer<kj::ArrayPtr<const_char>_> *rest_6,NoInfer<kj::String> *rest_7,
          NoInfer<kj::ArrayPtr<const_char>_> *rest_8,NoInfer<kj::CappedArray<char,_14UL>_> *rest_9,
          NoInfer<kj::ArrayPtr<const_char>_> *rest_10,NoInfer<kj::StringTree> *rest_11,
          NoInfer<kj::StringTree> *rest_12,NoInfer<kj::ArrayPtr<const_char>_> *rest_13,
          NoInfer<kj::ArrayPtr<const_char>_> *rest_14,NoInfer<kj::ArrayPtr<const_char>_> *rest_15,
          NoInfer<kj::ArrayPtr<const_char>_> *rest_16,NoInfer<kj::ArrayPtr<const_char>_> *rest_17,
          NoInfer<kj::String> *rest_18,NoInfer<kj::ArrayPtr<const_char>_> *rest_19,
          NoInfer<kj::ArrayPtr<const_char>_> *rest_20,NoInfer<kj::ArrayPtr<const_char>_> *rest_21,
          NoInfer<kj::String> *rest_22,NoInfer<kj::ArrayPtr<const_char>_> *rest_23,
          NoInfer<kj::CappedArray<char,_14UL>_> *rest_24,NoInfer<kj::ArrayPtr<const_char>_> *rest_25
          ,NoInfer<kj::StringTree> *rest_26,NoInfer<kj::ArrayPtr<const_char>_> *rest_27,
          NoInfer<kj::ArrayPtr<const_char>_> *rest_28,NoInfer<kj::ArrayPtr<const_char>_> *rest_29,
          NoInfer<kj::ArrayPtr<const_char>_> *rest_30,NoInfer<kj::ArrayPtr<const_char>_> *rest_31,
          NoInfer<kj::String> *rest_32,NoInfer<kj::ArrayPtr<const_char>_> *rest_33,
          NoInfer<kj::ArrayPtr<const_char>_> *rest_34,NoInfer<kj::ArrayPtr<const_char>_> *rest_35,
          NoInfer<kj::String> *rest_36,NoInfer<kj::ArrayPtr<const_char>_> *rest_37,
          NoInfer<kj::CappedArray<char,_14UL>_> *rest_38,NoInfer<kj::ArrayPtr<const_char>_> *rest_39
          ,NoInfer<kj::StringTree> *rest_40,NoInfer<kj::ArrayPtr<const_char>_> *rest_41,
          NoInfer<kj::ArrayPtr<const_char>_> *rest_42,NoInfer<kj::ArrayPtr<const_char>_> *rest_43,
          NoInfer<kj::ArrayPtr<const_char>_> *rest_44,NoInfer<kj::ArrayPtr<const_char>_> *rest_45,
          NoInfer<kj::String> *rest_46,NoInfer<kj::ArrayPtr<const_char>_> *rest_47,
          NoInfer<kj::ArrayPtr<const_char>_> *rest_48,NoInfer<kj::ArrayPtr<const_char>_> *rest_49,
          NoInfer<kj::String> *rest_50,NoInfer<kj::ArrayPtr<const_char>_> *rest_51,
          NoInfer<kj::CappedArray<char,_14UL>_> *rest_52,NoInfer<kj::ArrayPtr<const_char>_> *rest_53
          ,NoInfer<kj::StringTree> *rest_54,NoInfer<kj::ArrayPtr<const_char>_> *rest_55,
          NoInfer<kj::String> *rest_56,NoInfer<kj::ArrayPtr<const_char>_> *rest_57,
          NoInfer<kj::ArrayPtr<const_char>_> *rest_58,NoInfer<kj::ArrayPtr<const_char>_> *rest_59,
          NoInfer<kj::ArrayPtr<const_char>_> *rest_60,NoInfer<kj::ArrayPtr<const_char>_> *rest_61,
          NoInfer<kj::ArrayPtr<const_char>_> *rest_62,NoInfer<kj::ArrayPtr<const_char>_> *rest_63)

{
  Array<char> *pAVar1;
  size_t sVar2;
  char *pcVar3;
  Branch *pBVar4;
  String *pSVar5;
  ArrayPtr<const_char> *pAVar6;
  ArrayPtr<const_char> *pAVar7;
  ArrayPtr<const_char> *pAVar8;
  ArrayPtr<const_char> *pAVar9;
  ArrayPtr<const_char> *pAVar10;
  ArrayPtr<const_char> *pAVar11;
  ArrayPtr<const_char> *pAVar12;
  ArrayPtr<const_char> *pAVar13;
  CappedArray<char,_14UL> *pCVar14;
  ArrayPtr<const_char> *pAVar15;
  StringTree *pSVar16;
  StringTree *pSVar17;
  ArrayPtr<const_char> *pAVar18;
  ArrayPtr<const_char> *pAVar19;
  ArrayPtr<const_char> *pAVar20;
  ArrayPtr<const_char> *pAVar21;
  ArrayPtr<const_char> *pAVar22;
  String *pSVar23;
  ArrayPtr<const_char> *pAVar24;
  ArrayPtr<const_char> *pAVar25;
  ArrayPtr<const_char> *pAVar26;
  String *pSVar27;
  ArrayPtr<const_char> *pAVar28;
  CappedArray<char,_14UL> *pCVar29;
  ArrayPtr<const_char> *pAVar30;
  StringTree *pSVar31;
  ArrayPtr<const_char> *pAVar32;
  ArrayPtr<const_char> *pAVar33;
  ArrayPtr<const_char> *pAVar34;
  ArrayPtr<const_char> *pAVar35;
  ArrayPtr<const_char> *pAVar36;
  String *pSVar37;
  ArrayPtr<const_char> *pAVar38;
  ArrayPtr<const_char> *pAVar39;
  ArrayPtr<const_char> *pAVar40;
  String *pSVar41;
  ArrayPtr<const_char> *pAVar42;
  CappedArray<char,_14UL> *pCVar43;
  ArrayPtr<const_char> *pAVar44;
  StringTree *pSVar45;
  ArrayPtr<const_char> *pAVar46;
  ArrayPtr<const_char> *pAVar47;
  ArrayPtr<const_char> *pAVar48;
  ArrayPtr<const_char> *pAVar49;
  ArrayPtr<const_char> *pAVar50;
  String *pSVar51;
  ArrayPtr<const_char> *pAVar52;
  ArrayPtr<const_char> *pAVar53;
  ArrayPtr<const_char> *pAVar54;
  String *pSVar55;
  ArrayPtr<const_char> *pAVar56;
  CappedArray<char,_14UL> *pCVar57;
  ArrayPtr<const_char> *pAVar58;
  StringTree *pSVar59;
  ArrayPtr<const_char> *pAVar60;
  String *pSVar61;
  ArrayPtr<const_char> *pAVar62;
  ArrayPtr<const_char> *pAVar63;
  ArrayPtr<const_char> *pAVar64;
  ArrayPtr<const_char> *pAVar65;
  ArrayPtr<const_char> *pAVar66;
  ArrayPtr<const_char> *pAVar67;
  ArrayPtr<const_char> *pAVar68;
  String *pSVar69;
  NoInfer<kj::String> *in_stack_000001f8;
  NoInfer<kj::ArrayPtr<const_char>_> *in_stack_00000200;
  NoInfer<kj::CappedArray<char,_14UL>_> *in_stack_00000208;
  NoInfer<kj::ArrayPtr<const_char>_> *in_stack_00000210;
  StringTree local_98;
  NoInfer<kj::ArrayPtr<const_char>_> *local_60;
  ArrayPtr<const_char> *rest_local_1;
  ArrayPtr<const_char> *rest_local;
  String *first_local;
  size_t branchIndex_local;
  char *pos_local;
  StringTree *this_local;
  
  local_60 = rest_1;
  rest_local_1 = rest;
  rest_local = first;
  first_local = branchIndex;
  branchIndex_local = pos;
  pos_local = (char *)this;
  pcVar3 = String::begin(&this->text);
  pBVar4 = Array<kj::StringTree::Branch>::operator[](&this->branches,(size_t)first_local);
  pBVar4->index = pos - (long)pcVar3;
  pSVar5 = mv<kj::String>((String *)rest_local);
  StringTree(&local_98,pSVar5);
  pBVar4 = Array<kj::StringTree::Branch>::operator[](&this->branches,(size_t)first_local);
  operator=(&pBVar4->content,&local_98);
  ~StringTree(&local_98);
  sVar2 = branchIndex_local;
  pAVar1 = &first_local->content;
  pAVar6 = fwd<kj::ArrayPtr<char_const>>(rest_local_1);
  pAVar7 = fwd<kj::ArrayPtr<char_const>>(local_60);
  pAVar8 = fwd<kj::ArrayPtr<char_const>>(rest_2);
  pAVar9 = fwd<kj::ArrayPtr<char_const>>(rest_3);
  pAVar10 = fwd<kj::ArrayPtr<char_const>>(rest_4);
  pAVar11 = fwd<kj::ArrayPtr<char_const>>(rest_5);
  pAVar12 = fwd<kj::ArrayPtr<char_const>>(rest_6);
  pSVar5 = fwd<kj::String>(rest_7);
  pAVar13 = fwd<kj::ArrayPtr<char_const>>(rest_8);
  pCVar14 = fwd<kj::CappedArray<char,14ul>>(rest_9);
  pAVar15 = fwd<kj::ArrayPtr<char_const>>(rest_10);
  pSVar16 = fwd<kj::StringTree>(rest_11);
  pSVar17 = fwd<kj::StringTree>(rest_12);
  pAVar18 = fwd<kj::ArrayPtr<char_const>>(rest_13);
  pAVar19 = fwd<kj::ArrayPtr<char_const>>(rest_14);
  pAVar20 = fwd<kj::ArrayPtr<char_const>>(rest_15);
  pAVar21 = fwd<kj::ArrayPtr<char_const>>(rest_16);
  pAVar22 = fwd<kj::ArrayPtr<char_const>>(rest_17);
  pSVar23 = fwd<kj::String>(rest_18);
  pAVar24 = fwd<kj::ArrayPtr<char_const>>(rest_19);
  pAVar25 = fwd<kj::ArrayPtr<char_const>>(rest_20);
  pAVar26 = fwd<kj::ArrayPtr<char_const>>(rest_21);
  pSVar27 = fwd<kj::String>(rest_22);
  pAVar28 = fwd<kj::ArrayPtr<char_const>>(rest_23);
  pCVar29 = fwd<kj::CappedArray<char,14ul>>(rest_24);
  pAVar30 = fwd<kj::ArrayPtr<char_const>>(rest_25);
  pSVar31 = fwd<kj::StringTree>(rest_26);
  pAVar32 = fwd<kj::ArrayPtr<char_const>>(rest_27);
  pAVar33 = fwd<kj::ArrayPtr<char_const>>(rest_28);
  pAVar34 = fwd<kj::ArrayPtr<char_const>>(rest_29);
  pAVar35 = fwd<kj::ArrayPtr<char_const>>(rest_30);
  pAVar36 = fwd<kj::ArrayPtr<char_const>>(rest_31);
  pSVar37 = fwd<kj::String>(rest_32);
  pAVar38 = fwd<kj::ArrayPtr<char_const>>(rest_33);
  pAVar39 = fwd<kj::ArrayPtr<char_const>>(rest_34);
  pAVar40 = fwd<kj::ArrayPtr<char_const>>(rest_35);
  pSVar41 = fwd<kj::String>(rest_36);
  pAVar42 = fwd<kj::ArrayPtr<char_const>>(rest_37);
  pCVar43 = fwd<kj::CappedArray<char,14ul>>(rest_38);
  pAVar44 = fwd<kj::ArrayPtr<char_const>>(rest_39);
  pSVar45 = fwd<kj::StringTree>(rest_40);
  pAVar46 = fwd<kj::ArrayPtr<char_const>>(rest_41);
  pAVar47 = fwd<kj::ArrayPtr<char_const>>(rest_42);
  pAVar48 = fwd<kj::ArrayPtr<char_const>>(rest_43);
  pAVar49 = fwd<kj::ArrayPtr<char_const>>(rest_44);
  pAVar50 = fwd<kj::ArrayPtr<char_const>>(rest_45);
  pSVar51 = fwd<kj::String>(rest_46);
  pAVar52 = fwd<kj::ArrayPtr<char_const>>(rest_47);
  pAVar53 = fwd<kj::ArrayPtr<char_const>>(rest_48);
  pAVar54 = fwd<kj::ArrayPtr<char_const>>(rest_49);
  pSVar55 = fwd<kj::String>(rest_50);
  pAVar56 = fwd<kj::ArrayPtr<char_const>>(rest_51);
  pCVar57 = fwd<kj::CappedArray<char,14ul>>(rest_52);
  pAVar58 = fwd<kj::ArrayPtr<char_const>>(rest_53);
  pSVar59 = fwd<kj::StringTree>(rest_54);
  pAVar60 = fwd<kj::ArrayPtr<char_const>>(rest_55);
  pSVar61 = fwd<kj::String>(rest_56);
  pAVar62 = fwd<kj::ArrayPtr<char_const>>(rest_57);
  pAVar63 = fwd<kj::ArrayPtr<char_const>>(rest_58);
  pAVar64 = fwd<kj::ArrayPtr<char_const>>(rest_59);
  pAVar65 = fwd<kj::ArrayPtr<char_const>>(rest_60);
  pAVar66 = fwd<kj::ArrayPtr<char_const>>(rest_61);
  pAVar67 = fwd<kj::ArrayPtr<char_const>>(rest_62);
  pAVar68 = fwd<kj::ArrayPtr<char_const>>(rest_63);
  pSVar69 = fwd<kj::String>(in_stack_000001f8);
  fwd<kj::ArrayPtr<char_const>>(in_stack_00000200);
  fwd<kj::CappedArray<char,14ul>>(in_stack_00000208);
  fwd<kj::ArrayPtr<char_const>>(in_stack_00000210);
  fill<kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::CappedArray<char,14ul>,kj::ArrayPtr<char_const>,kj::StringTree,kj::StringTree,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::CappedArray<char,14ul>,kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::CappedArray<char,14ul>,kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::CappedArray<char,14ul>,kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::CappedArray<char,14ul>,kj::ArrayPtr<char_const>>
            (this,sVar2,(undefined1 *)((long)&pAVar1->ptr + 1),pAVar6,pAVar7,pAVar8,pAVar9,pAVar10,
             pAVar11,pAVar12,pSVar5,pAVar13,pCVar14,pAVar15,pSVar16,pSVar17,pAVar18,pAVar19,pAVar20,
             pAVar21,pAVar22,pSVar23,pAVar24,pAVar25,pAVar26,pSVar27,pAVar28,pCVar29,pAVar30,pSVar31
             ,pAVar32,pAVar33,pAVar34,pAVar35,pAVar36,pSVar37,pAVar38,pAVar39,pAVar40,pSVar41,
             pAVar42,pCVar43,pAVar44,pSVar45,pAVar46,pAVar47,pAVar48,pAVar49,pAVar50,pSVar51,pAVar52
             ,pAVar53,pAVar54,pSVar55,pAVar56,pCVar57,pAVar58,pSVar59,pAVar60,pSVar61,pAVar62,
             pAVar63,pAVar64,pAVar65,pAVar66,pAVar67,pAVar68,pSVar69);
  return;
}

Assistant:

void StringTree::fill(char* pos, size_t branchIndex, String&& first, Rest&&... rest) {
  branches[branchIndex].index = pos - text.begin();
  branches[branchIndex].content = StringTree(kj::mv(first));
  fill(pos, branchIndex + 1, kj::fwd<Rest>(rest)...);
}